

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PMap::PMap(PMap *this,PType *keytype,PType *valtype)

{
  PCompoundType::PCompoundType(&this->super_PCompoundType);
  (this->super_PCompoundType).super_PType.super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006edee0;
  this->KeyType = keytype;
  this->ValueType = valtype;
  FString::Format(&(this->super_PCompoundType).super_PType.mDescriptiveName,"Map<%s, %s>",
                  (keytype->mDescriptiveName).Chars,(valtype->mDescriptiveName).Chars);
  *(undefined8 *)&(this->super_PCompoundType).super_PType.super_PTypeBase.super_DObject.field_0x24 =
       0x800000018;
  return;
}

Assistant:

PMap::PMap(PType *keytype, PType *valtype)
: KeyType(keytype), ValueType(valtype)
{
	mDescriptiveName.Format("Map<%s, %s>", keytype->DescriptiveName(), valtype->DescriptiveName());
	Size = sizeof(FMap);
	Align = alignof(FMap);
}